

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

Id __thiscall
dxil_spv::Converter::Impl::build_sampled_image(Impl *this,Id image_id,Id sampler_id,bool comparison)

{
  pointer *ppCVar1;
  pointer pCVar2;
  iterator __position;
  bool ms;
  Id IVar3;
  mapped_type *pmVar4;
  Builder *this_00;
  Operation *this_01;
  pointer pCVar5;
  long lVar6;
  bool bVar7;
  pointer pCVar8;
  Id *pIVar9;
  Id sampler_id_local;
  Id image_id_local;
  bool local_4d;
  Dim local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  Id local_38;
  Id local_34;
  
  sampler_id_local = sampler_id;
  image_id_local = image_id;
  pmVar4 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->handle_to_resource_meta,&image_id_local);
  bVar7 = true;
  if (pmVar4->non_uniform == false) {
    pmVar4 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->handle_to_resource_meta,&sampler_id_local);
    bVar7 = pmVar4->non_uniform;
  }
  pCVar8 = (this->combined_image_sampler_cache).
           super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->combined_image_sampler_cache).
           super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar6 = (long)pCVar2 - (long)pCVar8 >> 6;
  pCVar5 = pCVar8;
  if (0 < lVar6) {
    pCVar5 = (pointer)((long)&pCVar8->image_id + ((long)pCVar2 - (long)pCVar8 & 0xffffffffffffffc0U)
                      );
    lVar6 = lVar6 + 1;
    pCVar8 = pCVar8 + 2;
    do {
      if (((pCVar8[-2].image_id == image_id_local) && (pCVar8[-2].sampler_id == sampler_id_local))
         && (pCVar8[-2].non_uniform == bVar7)) {
        pCVar8 = pCVar8 + -2;
        goto LAB_0011fae9;
      }
      if (((pCVar8[-1].image_id == image_id_local) && (pCVar8[-1].sampler_id == sampler_id_local))
         && (pCVar8[-1].non_uniform == bVar7)) {
        pCVar8 = pCVar8 + -1;
        goto LAB_0011fae9;
      }
      if (((pCVar8->image_id == image_id_local) && (pCVar8->sampler_id == sampler_id_local)) &&
         (pCVar8->non_uniform == bVar7)) goto LAB_0011fae9;
      if (((pCVar8[1].image_id == image_id_local) && (pCVar8[1].sampler_id == sampler_id_local)) &&
         (pCVar8[1].non_uniform == bVar7)) {
        pCVar8 = pCVar8 + 1;
        goto LAB_0011fae9;
      }
      lVar6 = lVar6 + -1;
      pCVar8 = pCVar8 + 4;
    } while (1 < lVar6);
  }
  lVar6 = (long)pCVar2 - (long)pCVar5 >> 4;
  if (lVar6 != 1) {
    if (lVar6 != 2) {
      pCVar8 = pCVar2;
      if ((lVar6 != 3) ||
         (((pCVar5->image_id == image_id_local && (pCVar5->sampler_id == sampler_id_local)) &&
          (pCVar8 = pCVar5, pCVar5->non_uniform == bVar7)))) goto LAB_0011fae9;
      pCVar5 = pCVar5 + 1;
    }
    if (((pCVar5->image_id == image_id_local) && (pCVar5->sampler_id == sampler_id_local)) &&
       (pCVar8 = pCVar5, pCVar5->non_uniform == bVar7)) goto LAB_0011fae9;
    pCVar5 = pCVar5 + 1;
  }
  pCVar8 = pCVar2;
  if (((pCVar5->image_id == image_id_local) && (pCVar5->sampler_id == sampler_id_local)) &&
     (pCVar8 = pCVar5, pCVar5->non_uniform != bVar7)) {
    pCVar8 = pCVar2;
  }
LAB_0011fae9:
  if (pCVar8 == pCVar2) {
    this_00 = SPIRVModule::get_builder(this->spirv_module);
    IVar3 = get_type_id(this,image_id_local);
    local_4c = spv::Builder::getTypeDimensionality(this_00,IVar3);
    local_4d = spv::Builder::isArrayedImageType(this_00,IVar3);
    ms = spv::Builder::isMultisampledImageType(this_00,IVar3);
    IVar3 = spv::Builder::getImageComponentType(this_00,IVar3);
    IVar3 = spv::Builder::makeImageType
                      (this_00,IVar3,local_4c,comparison,local_4d,ms,1,ImageFormatUnknown);
    IVar3 = spv::Builder::makeSampledImageType(this_00,IVar3);
    this_01 = allocate(this,OpSampledImage,IVar3);
    local_48 = &local_38;
    local_38 = image_id_local;
    local_34 = sampler_id_local;
    uStack_40 = 2;
    Operation::add_ids(this_01,(initializer_list<unsigned_int> *)&local_48);
    add(this,this_01,false);
    if (bVar7 != false) {
      spv::Builder::addDecoration(this_00,this_01->id,DecorationNonUniform,-1);
      this_01->flags = this_01->flags | 1;
    }
    local_48 = (Id *)CONCAT44(sampler_id_local,image_id_local);
    IVar3 = this_01->id;
    uStack_40._0_5_ = CONCAT14(bVar7,IVar3);
    __position._M_current =
         (this->combined_image_sampler_cache).
         super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->combined_image_sampler_cache).
        super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
      ::_M_realloc_insert<dxil_spv::Converter::Impl::CombinedImageSampler>
                (&this->combined_image_sampler_cache,__position,(CombinedImageSampler *)&local_48);
    }
    else {
      *(Id **)__position._M_current = local_48;
      (__position._M_current)->combined_id = IVar3;
      (__position._M_current)->non_uniform = bVar7;
      *(undefined3 *)&(__position._M_current)->field_0xd = uStack_40._5_3_;
      ppCVar1 = &(this->combined_image_sampler_cache).
                 super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppCVar1 = *ppCVar1 + 1;
    }
    pIVar9 = &this_01->id;
  }
  else {
    pIVar9 = &pCVar8->combined_id;
  }
  return *pIVar9;
}

Assistant:

spv::Id Converter::Impl::build_sampled_image(spv::Id image_id, spv::Id sampler_id, bool comparison)
{
	bool is_non_uniform =
	    handle_to_resource_meta[image_id].non_uniform || handle_to_resource_meta[sampler_id].non_uniform;

	auto itr = std::find_if(combined_image_sampler_cache.begin(), combined_image_sampler_cache.end(),
	                        [&](const CombinedImageSampler &combined) {
		                        return combined.image_id == image_id && combined.sampler_id == sampler_id &&
		                               combined.non_uniform == is_non_uniform;
	                        });

	if (itr != combined_image_sampler_cache.end())
		return itr->combined_id;

	auto &builder = spirv_module.get_builder();
	spv::Id image_type_id = get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool arrayed = builder.isArrayedImageType(image_type_id);
	bool multisampled = builder.isMultisampledImageType(image_type_id);
	spv::Id sampled_format = builder.getImageComponentType(image_type_id);

	image_type_id =
	    builder.makeImageType(sampled_format, dim, comparison, arrayed, multisampled, 1, spv::ImageFormatUnknown);

	Operation *op = allocate(spv::OpSampledImage, builder.makeSampledImageType(image_type_id));
	op->add_ids({ image_id, sampler_id });
	add(op);

	if (is_non_uniform)
	{
		builder.addDecoration(op->id, spv::DecorationNonUniformEXT);
		op->flags |= Operation::SinkableBit;
	}

	combined_image_sampler_cache.push_back({ image_id, sampler_id, op->id, is_non_uniform });
	return op->id;
}